

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int GetLast360DataFromThreadRPLIDARx
              (RPLIDAR *pRPLIDAR,double *pDistances,double *pAngles,int *pNbMeasurements)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  int local_3c;
  int i;
  int res;
  int id;
  int *pNbMeasurements_local;
  double *pAngles_local;
  double *pDistances_local;
  RPLIDAR *pRPLIDAR_local;
  
  i = 0;
  while ((RPLIDAR *)addrsRPLIDAR[i] != pRPLIDAR) {
    i = i + 1;
    if (0xf < i) {
      return 1;
    }
  }
  EnterCriticalSection(RPLIDARCS + i);
  sVar2 = std::deque<double,_std::allocator<double>_>::size(anglesvectorRPLIDAR + i);
  *pNbMeasurements = (int)sVar2;
  local_3c = *pNbMeasurements;
  while (local_3c = local_3c + -1, -1 < local_3c) {
    pvVar3 = std::deque<double,_std::allocator<double>_>::operator[]
                       (anglesvectorRPLIDAR + i,(long)local_3c);
    pAngles[local_3c] = *pvVar3;
    pvVar3 = std::deque<double,_std::allocator<double>_>::operator[]
                       (distancesvectorRPLIDAR + i,(long)local_3c);
    pDistances[local_3c] = *pvVar3;
  }
  iVar1 = resRPLIDAR[i];
  LeaveCriticalSection(RPLIDARCS + i);
  if (0 < *pNbMeasurements) {
    return iVar1;
  }
  return 2;
}

Assistant:

HARDWAREX_API int GetLast360DataFromThreadRPLIDARx(RPLIDAR* pRPLIDAR, double* pDistances, double* pAngles, int* pNbMeasurements)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsRPLIDAR[id] != pRPLIDAR)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

#ifdef __cplusplus
	EnterCriticalSection(&RPLIDARCS[id]);
	*pNbMeasurements = (int)anglesvectorRPLIDAR[id].size();
	for (int i = *pNbMeasurements-1; i >= 0; i--)
	{
		pAngles[i] = anglesvectorRPLIDAR[id][i];
		pDistances[i] = distancesvectorRPLIDAR[id][i];
	}
	res = resRPLIDAR[id];
	LeaveCriticalSection(&RPLIDARCS[id]);

	if (*pNbMeasurements <= 0) return EXIT_TIMEOUT;
	return res;
#else
	return EXIT_NOT_IMPLEMENTED;
#endif // __cplusplus
}